

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::Resize
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,hash_t nhsize)

{
  uint uVar1;
  Node *block;
  Node *pNVar2;
  ulong uVar3;
  IPair *other;
  FString FStack_38;
  
  uVar1 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  pNVar2 = block;
  for (uVar3 = (ulong)uVar1; uVar3 != 0; uVar3 = uVar3 - 1) {
    other = &pNVar2->Pair;
    if (*(long *)((long)(other + -1) + 8) != 1) {
      FString::AttachToOther(&FStack_38,&other->Key);
      pNVar2 = NewKey(this,&FStack_38);
      FString::~FString(&FStack_38);
      (pNVar2->Pair).Value = other->Value;
      FString::~FString(&other->Key);
    }
    pNVar2 = (Node *)(other + 1);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}